

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxboundflippingrt.hpp
# Opt level: O2

int __thiscall
soplex::SPxBoundFlippingRT<double>::selectLeave
          (SPxBoundFlippingRT<double> *this,double *val,double enterTest,bool polish)

{
  double dVar1;
  SPxSolverBase<double> *pSVar2;
  UpdateVector<double> *pUVar3;
  int *idx;
  pointer pBVar4;
  ulong uVar5;
  LPRowSetBase<double> *pLVar6;
  LPRowSetBase<double> *pLVar7;
  BreakpointSource BVar8;
  uint uVar9;
  bool bVar10;
  int iVar11;
  int iVar12;
  double *pdVar13;
  double *pdVar14;
  Breakpoint *keys;
  pointer pBVar15;
  double *pdVar16;
  long lVar17;
  long lVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  undefined4 uVar21;
  undefined4 uVar22;
  double dVar23;
  double dVar24;
  uint local_d4;
  int nBp;
  int leaveIdx;
  double local_c8;
  uint local_c0;
  int minIdx;
  double *local_b8;
  double local_b0;
  undefined1 local_a8 [16];
  double *local_98;
  double *local_90;
  double *local_88;
  BreakpointCompare local_80;
  SPxId baseId;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_70;
  undefined1 local_68 [16];
  double local_58;
  undefined8 uStack_50;
  Breakpoint tmp;
  
  pSVar2 = (this->super_SPxFastRT<double>).super_SPxRatioTester<double>.thesolver;
  if (pSVar2->enterCount % 100 == 0) {
    this->flipPotential = 1.0;
  }
  if ((((polish) || ((this->super_SPxFastRT<double>).field_0x51 != '\x01')) ||
      ((this->super_SPxFastRT<double>).field_0x52 != '\x01')) ||
     ((pSVar2->theRep == COLUMN || (this->flipPotential <= 0.0)))) {
    iVar11 = SPxFastRT<double>::selectLeave(&this->super_SPxFastRT<double>,val,enterTest,polish);
    return iVar11;
  }
  local_68._8_4_ = in_XMM0_Dc;
  local_68._0_8_ = enterTest;
  local_68._12_4_ = in_XMM0_Dd;
  pUVar3 = pSVar2->theFvec;
  pdVar14 = (pUVar3->super_VectorBase<double>).val.
            super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_start;
  local_b8 = (pUVar3->thedelta).super_VectorBase<double>.val.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start;
  idx = (pUVar3->thedelta).super_IdxSet.idx;
  iVar11 = (pUVar3->thedelta).super_IdxSet.num;
  pdVar13 = (pSVar2->theUBbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start;
  pdVar16 = (pSVar2->theLBbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start;
  leaveIdx = -1;
  local_b0 = *val;
  *val = 0.0;
  nBp = 0;
  minIdx = -1;
  if (local_b0 <= 0.0) {
    collectBreakpointsMin(this,&nBp,&minIdx,idx,iVar11,local_b8,pdVar14,pdVar13,pdVar16,FVEC);
  }
  else {
    collectBreakpointsMax(this,&nBp,&minIdx,idx,iVar11,local_b8,pdVar14,pdVar13,pdVar16,FVEC);
  }
  if (nBp == 0) {
    *val = local_b0;
    return -1;
  }
  pBVar4 = (this->breakpoints).data.
           super__Vector_base<soplex::SPxBoundFlippingRT<double>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<double>::Breakpoint>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pBVar15 = pBVar4 + minIdx;
  tmp.val = pBVar15->val;
  tmp.idx = pBVar15->idx;
  tmp.src = pBVar15->src;
  iVar11 = pBVar4->idx;
  BVar8 = pBVar4->src;
  pBVar15 = pBVar4 + minIdx;
  pBVar15->val = pBVar4->val;
  pBVar15->idx = iVar11;
  pBVar15->src = BVar8;
  pBVar15 = (this->breakpoints).data.
            super__Vector_base<soplex::SPxBoundFlippingRT<double>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<double>::Breakpoint>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pBVar15->val = tmp.val;
  pBVar15->idx = tmp.idx;
  pBVar15->src = tmp.src;
  dVar24 = local_68._0_8_;
  if ((dVar24 != 0.0) || (NAN(dVar24))) {
    uVar20 = SUB84(ABS(dVar24),0);
    uVar19 = (undefined4)((ulong)ABS(dVar24) >> 0x20);
    uVar5 = local_68._8_8_ & 0x7fffffffffffffff;
    uVar21 = (undefined4)uVar5;
    uVar22 = (undefined4)(uVar5 >> 0x20);
  }
  else {
    dVar24 = ((this->super_SPxFastRT<double>).super_SPxRatioTester<double>.thesolver)->
             instableEnterVal;
    uVar20 = SUB84(dVar24,0);
    uVar19 = (undefined4)((ulong)dVar24 >> 0x20);
    uVar21 = 0;
    uVar22 = 0;
  }
  dVar24 = (double)CONCAT44(uVar19,uVar20);
  local_c0 = 0xffffffff;
  local_80.entry =
       (this->breakpoints).data.
       super__Vector_base<soplex::SPxBoundFlippingRT<double>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<double>::Breakpoint>_>
       ._M_impl.super__Vector_impl_data._M_start;
  lVar18 = 0;
  lVar17 = 8;
  iVar11 = 0;
  dVar23 = 0.0;
  local_98 = pdVar16;
  local_90 = pdVar14;
  local_88 = pdVar13;
  while ((iVar12 = (int)lVar18, iVar12 < nBp && (0.0 < dVar24))) {
    local_a8._8_4_ = uVar21;
    local_a8._0_8_ = dVar24;
    local_a8._12_4_ = uVar22;
    keys = (this->breakpoints).data.
           super__Vector_base<soplex::SPxBoundFlippingRT<double>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<double>::Breakpoint>_>
           ._M_impl.super__Vector_impl_data._M_start;
    local_c8 = dVar23;
    if (iVar11 < iVar12) {
      iVar11 = SPxQuicksortPart<soplex::SPxBoundFlippingRT<double>::Breakpoint,soplex::SPxBoundFlippingRT<double>::BreakpointCompare>
                         (keys,&local_80,iVar11 + 1,nBp,4,0,0,true);
      keys = (this->breakpoints).data.
             super__Vector_base<soplex::SPxBoundFlippingRT<double>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<double>::Breakpoint>_>
             ._M_impl.super__Vector_impl_data._M_start;
    }
    iVar12 = *(int *)((long)&keys->val + lVar17);
    local_58 = ABS(local_b8[iVar12]);
    uStack_50 = 0;
    pSVar2 = (this->super_SPxFastRT<double>).super_SPxRatioTester<double>.thesolver;
    baseId.super_DataKey = (pSVar2->super_SPxBasisBase<double>).theBaseId.data[iVar12].super_DataKey
    ;
    iVar12 = SPxLPBase<double>::number(&pSVar2->super_SPxLPBase<double>,&baseId);
    pSVar2 = (this->super_SPxFastRT<double>).super_SPxRatioTester<double>.thesolver;
    pLVar6 = &(pSVar2->super_SPxLPBase<double>).super_LPRowSetBase<double>;
    if (0 < baseId.super_DataKey.info) {
      pLVar6 = (LPRowSetBase<double> *)&(pSVar2->super_SPxLPBase<double>).super_LPColSetBase<double>
      ;
    }
    pLVar7 = (LPRowSetBase<double> *)&(pSVar2->super_SPxLPBase<double>).super_LPColSetBase<double>;
    if (baseId.super_DataKey.info < 1) {
      pLVar7 = &(pSVar2->super_SPxLPBase<double>).super_LPRowSetBase<double>;
    }
    uVar21 = local_a8._8_4_;
    uVar22 = local_a8._12_4_;
    dVar24 = local_a8._0_8_ -
             ((pLVar6->right).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[iVar12] * local_58 -
             (pLVar7->left).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[iVar12] * local_58);
    dVar23 = local_58;
    if (local_58 <= local_c8) {
      dVar23 = local_c8;
    }
    lVar18 = lVar18 + 1;
    lVar17 = lVar17 + 0x10;
  }
  local_d4 = iVar12 - 1;
  if ((nBp <= iVar12) &&
     (pdVar14 = &(this->super_SPxFastRT<double>).super_SPxRatioTester<double>.delta,
     *pdVar14 <= dVar24 && dVar24 != *pdVar14)) {
    this->flipPotential = this->flipPotential + -0.5;
    *val = local_b0;
    iVar11 = SPxFastRT<double>::selectLeave
                       (&this->super_SPxFastRT<double>,val,
                        (double)CONCAT44(local_68._4_4_,local_68._0_4_),false);
    return iVar11;
  }
  pBVar15 = (this->breakpoints).data.
            super__Vector_base<soplex::SPxBoundFlippingRT<double>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<double>::Breakpoint>_>
            ._M_impl.super__Vector_impl_data._M_start;
  dVar24 = *(double *)((long)pBVar15 + lVar17 + -0x18);
  pdVar14 = local_b8;
  local_a8._0_8_ = dVar24;
  for (; lVar18 < nBp; lVar18 = lVar18 + 1) {
    if ((long)iVar11 <= lVar18 + -1) {
      local_c8 = dVar23;
      iVar11 = SPxQuicksortPart<soplex::SPxBoundFlippingRT<double>::Breakpoint,soplex::SPxBoundFlippingRT<double>::BreakpointCompare>
                         (pBVar15,&local_80,iVar11 + 1,nBp,4,0,0,true);
      pBVar15 = (this->breakpoints).data.
                super__Vector_base<soplex::SPxBoundFlippingRT<double>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<double>::Breakpoint>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pdVar14 = local_b8;
      dVar23 = local_c8;
      dVar24 = (double)local_a8._0_8_;
    }
    iVar12 = *(int *)((long)&pBVar15->val + lVar17);
    dVar1 = pdVar14[iVar12];
    if (ABS(dVar1) <= dVar23) {
      if ((this->super_SPxFastRT<double>).super_SPxRatioTester<double>.delta + dVar24 < 0.0) break;
    }
    else {
      pdVar13 = local_88;
      if (dVar1 <= 0.0) {
        pdVar13 = local_98;
      }
      if ((pdVar13[iVar12] - local_90[iVar12]) / dVar1 <= dVar24) {
        local_c0 = (uint)lVar18;
        dVar23 = ABS(dVar1);
      }
    }
    lVar17 = lVar17 + 0x10;
  }
  local_a8._0_8_ = (this->super_SPxFastRT<double>).fastDelta;
  bVar10 = ((this->super_SPxFastRT<double>).super_SPxRatioTester<double>.thesolver)->instableEnter;
  local_c8 = dVar23;
  std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)&baseId,
             &(this->super_SPxFastRT<double>).super_SPxRatioTester<double>._tolerances.
              super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
  local_58 = *(double *)((long)baseId.super_DataKey + 0x40);
  uStack_50 = 0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_70);
  pdVar13 = local_90;
  pdVar14 = local_98;
  uVar20 = (undefined4)((ulong)local_c8 >> 0x20);
  if (bVar10 == false) {
    dVar24 = (this->super_SPxFastRT<double>).minStab;
    dVar24 = (double)(-(ulong)(local_c8 < 1000.0) & (ulong)dVar24 |
                     ~-(ulong)(local_c8 < 1000.0) & (ulong)((local_c8 * dVar24) / 1000.0));
  }
  else {
    dVar24 = (double)(~-(ulong)(local_58 == 1.0) & (ulong)(local_58 * 1e-10) |
                     -(ulong)(local_58 == 1.0) & 0x3ddb7cdfd9d7bdbb);
  }
  uVar19 = SUB84(local_c8,0);
  local_a8._0_8_ = (double)local_a8._0_8_ / local_c8;
  if ((int)local_c0 < 0) {
    bVar10 = false;
    pdVar16 = local_b8;
    while ((uVar9 = local_d4, bVar10 == false && (-1 < (int)local_d4))) {
      iVar11 = (this->breakpoints).data.
               super__Vector_base<soplex::SPxBoundFlippingRT<double>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<double>::Breakpoint>_>
               ._M_impl.super__Vector_impl_data._M_start[local_d4].idx;
      if (iVar11 < 0) {
        bVar10 = false;
      }
      else {
        bVar10 = getData(this,val,&leaveIdx,iVar11,(double)CONCAT44(uVar20,uVar19),
                         (double)local_a8._0_8_,pdVar16,pdVar13,pdVar14,local_88,FVEC,local_b0);
        uVar19 = SUB84(local_c8,0);
        uVar20 = (undefined4)((ulong)local_c8 >> 0x20);
        pdVar16 = local_b8;
      }
      local_d4 = uVar9 - 1;
    }
    local_d4 = local_d4 + 1;
    if (bVar10 != false) goto LAB_00208491;
  }
  else if ((dVar24 < local_c8) &&
          (bVar10 = getData(this,val,&leaveIdx,
                            (this->breakpoints).data.
                            super__Vector_base<soplex::SPxBoundFlippingRT<double>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<double>::Breakpoint>_>
                            ._M_impl.super__Vector_impl_data._M_start[local_c0].idx,local_c8,
                            (double)local_a8._0_8_,local_b8,local_90,local_98,local_88,FVEC,local_b0
                           ), bVar10)) {
LAB_00208491:
    uVar9 = local_d4;
    this->relax_count = 0;
    SPxFastRT<double>::tighten(&this->super_SPxFastRT<double>);
    if (((int)uVar9 < 1) ||
       (dVar24 = ABS((this->breakpoints).data.
                     super__Vector_base<soplex::SPxBoundFlippingRT<double>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<double>::Breakpoint>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar9].val),
       pdVar14 = &(this->super_SPxFastRT<double>).fastDelta, dVar24 < *pdVar14 || dVar24 == *pdVar14
       )) {
      ((this->super_SPxFastRT<double>).super_SPxRatioTester<double>.thesolver)->boundflips = 0;
      dVar24 = this->flipPotential + -0.1;
    }
    else {
      flipAndUpdate(this,(int *)&local_d4);
      ((this->super_SPxFastRT<double>).super_SPxRatioTester<double>.thesolver)->boundflips =
           local_d4;
      if ((int)local_d4 < 10) {
        dVar24 = this->flipPotential + -0.05;
      }
      else {
        dVar24 = 1.0;
      }
    }
    this->flipPotential = dVar24;
    return leaveIdx;
  }
  if (this->relax_count < 2) {
    SPxFastRT<double>::relax(&this->super_SPxFastRT<double>);
    this->relax_count = this->relax_count + 1;
    *val = local_b0;
    leaveIdx = selectLeave(this,val,(double)local_68._0_8_,false);
  }
  return leaveIdx;
}

Assistant:

int SPxBoundFlippingRT<R>::selectLeave(
   R&                 val,
   R                  enterTest,
   bool                  polish
)
{
   assert(this->m_type == SPxSolverBase<R>::ENTER);
   assert(this->thesolver->boundflips == 0);

   // reset the history and try again to do some long steps
   if(this->thesolver->enterCount % SOPLEX_LONGSTEP_FREQ == 0)
   {
      SPxOut::debug(this, "DEBFRT06 resetting long step history\n");
      flipPotential = 1;
   }

   if(polish || !enableBoundFlips || !enableRowBoundFlips
         || this->thesolver->rep() == SPxSolverBase<R>::COLUMN || flipPotential <= 0)
   {
      SPxOut::debug(this, "DEBFRT07 switching to fast ratio test\n");
      return SPxFastRT<R>::selectLeave(val, enterTest, polish);
   }

   const R*  vec =
      this->thesolver->fVec().get_const_ptr();         /**< pointer to values of current VectorBase<R> */
   const R*  upd =
      this->thesolver->fVec().delta().values();        /**< pointer to update values of current VectorBase<R> */
   const int*   idx =
      this->thesolver->fVec().delta().indexMem();      /**< pointer to indices of current VectorBase<R> */
   int          updnnz =
      this->thesolver->fVec().delta().size();       /**< number of nonzeros in update VectorBase<R> */
   const R*  lb  =
      this->thesolver->lbBound().get_const_ptr();      /**< pointer to lower bound/lhs of current VectorBase<R> */
   const R*  ub  =
      this->thesolver->ubBound().get_const_ptr();      /**< pointer to upper bound/rhs of current VectorBase<R> */

   R max;

   // index in breakpoint array of minimal value (i.e. choice of normal RT)
   int minIdx;

   // temporary breakpoint data structure to make swaps possible
   Breakpoint tmp;

   // most stable pivot value in candidate set
   R moststable;

   // initialize invalid leaving index
   int leaveIdx = -1;

   // slope of objective function improvement
   R slope;

   // number of found breakpoints
   int nBp;

   // number of passed breakpoints
   int npassedBp;

   R degeneps;
   R stab;
   bool instable;

   max = val;
   val = 0.0;
   moststable = 0.0;
   nBp = 0;
   minIdx = -1;

   assert(this->thesolver->fVec().delta().isSetup());

   // get breakpoints and and determine the index of the minimal value
   if(max > 0)
   {
      collectBreakpointsMax(nBp, minIdx, idx, updnnz, upd, vec, ub, lb, FVEC);
   }
   else
   {
      collectBreakpointsMin(nBp, minIdx, idx, updnnz, upd, vec, ub, lb, FVEC);
   }

   // return -1 if no BP was found
   if(nBp == 0)
   {
      val = max;
      return leaveIdx;
   }

   assert(minIdx >= 0);

   // swap smallest breakpoint to the front to skip the sorting phase if no bound flip is possible
   tmp = breakpoints[minIdx];
   breakpoints[minIdx] = breakpoints[0];
   breakpoints[0] = tmp;

#ifndef NDEBUG

   if(std::is_floating_point<R>::value)
   {
      for(int i = 0; i < breakpoints.size(); ++i)
      {
         // nan values cannot be handled in sorting
         assert(!isnan(breakpoints[i].val));
         // the breakpoint formulas should not produce inf values
         assert(!isinf(breakpoints[i].val));
      }
   }

#endif

   // get initial slope
   slope = spxAbs(enterTest);

   if(slope == 0)
   {
      // this may only happen if SoPlex decides to make an instable pivot
      assert(this->thesolver->instableEnterId.isValid());
      // restore original slope
      slope = this->thesolver->instableEnterVal;
   }

   // set up structures for the quicksort implementation
   BreakpointCompare compare;
   compare.entry = breakpoints.get_const_ptr();

   // pointer to end of sorted part of breakpoints
   int sorted = 0;
   // minimum number of entries that are supposed to be sorted by partial sort
   int sortsize = 4;

   // get all skipable breakpoints
   for(npassedBp = 0; npassedBp < nBp && slope > 0; ++npassedBp)
   {
      // sort breakpoints only partially to save time
      if(npassedBp > sorted)
      {
         sorted = SPxQuicksortPart(breakpoints.get_ptr(), compare, sorted + 1, nBp, sortsize);
      }

      assert(breakpoints[npassedBp].src == FVEC);
      int breakpointidx = breakpoints[npassedBp].idx;
      // compute new slope
      R upper;
      R lower;
      R absupd = spxAbs(upd[breakpointidx]);
      SPxId baseId = this->thesolver->baseId(breakpointidx);
      int i = this->thesolver->number(baseId);

      if(baseId.isSPxColId())
      {
         upper = this->thesolver->upper(i);
         lower = this->thesolver->lower(i);
      }
      else
      {
         assert(baseId.isSPxRowId());
         upper = this->thesolver->rhs(i);
         lower = this->thesolver->lhs(i);
      }

      slope -= (upper * absupd) - (lower * absupd);

      // get most stable pivot
      if(absupd > moststable)
         moststable = absupd;
   }

   --npassedBp;
   assert(npassedBp >= 0);

   // check for unboundedness/infeasibility
   if(slope > this->delta && npassedBp >= nBp - 1)
   {
      SPxOut::debug(this, "DEBFRT02 {}: unboundedness in ratio test\n",
                    this->thesolver->basis().iteration());
      flipPotential -= 0.5;
      val = max;
      return SPxFastRT<R>::selectLeave(val, enterTest);
   }

   SPxOut::debug(this, "DEBFRT01 {}: number of flip candidates: {}\n",
                 this->thesolver->basis().iteration(), npassedBp);

   // try to get a more stable pivot by looking at those with similar step length
   int stableBp;              // index to walk over additional breakpoints (after slope change)
   int bestBp = -1;           // breakpoints index with best possible stability
   R bestDelta = breakpoints[npassedBp].val;  // best step length (after bound flips)

   for(stableBp = npassedBp + 1; stableBp < nBp; ++stableBp)
   {
      R stableDelta = 0;

      // get next breakpoints in increasing order
      if(stableBp > sorted)
      {
         sorted = SPxQuicksortPart(breakpoints.get_ptr(), compare, sorted + 1, nBp, sortsize);
      }

      int breakpointidx = breakpoints[stableBp].idx;
      assert(breakpoints[stableBp].src == FVEC);
      R x = upd[breakpointidx];

      if(spxAbs(x) > moststable)
      {
         stableDelta = (x > 0.0) ? ub[breakpointidx] : lb[breakpointidx];
         stableDelta = (stableDelta - vec[breakpointidx]) / x;

         if(stableDelta <= bestDelta)
         {
            moststable = spxAbs(x);
            bestBp = stableBp;
         }
      }
      // stop searching if the step length is too big
      else if(stableDelta > this->delta + bestDelta)
         break;
   }

   degeneps = this->fastDelta / moststable;  /* as in SPxFastRT */
   // get stability requirements
   instable = this->thesolver->instableEnter;
   assert(!instable || this->thesolver->instableEnterId.isValid());
   R lowstab = this->tolerances()->scaleAccordingToEpsilon(SOPLEX_LOWSTAB);
   stab = instable ? lowstab : SPxFastRT<R>::minStability(moststable);

   bool foundStable = false;

   if(bestBp >= 0)
   {
      // found a more stable pivot
      if(moststable > stab)
      {
         // stability requirements are satisfied
         int breakpointidx = breakpoints[bestBp].idx;
         assert(breakpointidx >= 0);
         foundStable = getData(val, leaveIdx, breakpointidx, moststable, degeneps, upd, vec, lb, ub, FVEC,
                               max);
      }
   }

   else
   {
      // scan passed breakpoints from back to front and stop as soon as a good one is found
      while(!foundStable && npassedBp >= 0)
      {
         int breakpointidx = breakpoints[npassedBp].idx;

         // only look for non-basic variables
         if(breakpointidx >= 0)
         {
            foundStable = getData(val, leaveIdx, breakpointidx, moststable, degeneps, upd, vec, lb, ub, FVEC,
                                  max);
         }

         --npassedBp;
      }

      ++npassedBp;
   }

   if(!foundStable)
   {
      assert(leaveIdx < 0);

      if(relax_count < SOPLEX_MAX_RELAX_COUNT)
      {
         SPxOut::debug(this, "DEBFRT04 {}: no valid leaveIdx found - relaxing...\n",
                       this->thesolver->basis().iteration());
         this->relax();
         ++relax_count;
         // restore original value
         val = max;
         // try again with relaxed delta
         return SPxBoundFlippingRT<R>::selectLeave(val, enterTest);
      }
      else
      {
         SPxOut::debug(this, "DEBFRT05 {}: no valid leaveIdx found - breaking...\n",
                       this->thesolver->basis().iteration());
         return leaveIdx;
      }
   }
   else
   {
      relax_count = 0;
      this->tighten();
   }

   // flip bounds of skipped breakpoints only if a nondegenerate step is to be performed
   if(npassedBp > 0 && spxAbs(breakpoints[npassedBp].val) > this->fastDelta)
   {
      flipAndUpdate(npassedBp);
      this->thesolver->boundflips = npassedBp;

      if(npassedBp >= 10)
         flipPotential = 1;
      else
         flipPotential -= 0.05;
   }
   else
   {
      this->thesolver->boundflips = 0;
      flipPotential -= 0.1;
   }

   SPxOut::debug(this, "DEBFRT06 {}: selected Index: {} number of candidates: {}\n",
                 this->thesolver->basis().iteration(), leaveIdx, nBp);

   return leaveIdx;
}